

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall
icu_63::DecimalFormat::applyPattern(DecimalFormat *this,UnicodeString *pattern,UErrorCode *status)

{
  setPropertiesFromPattern(this,pattern,0,status);
  touch(this,status);
  return;
}

Assistant:

void DecimalFormat::applyPattern(const UnicodeString& pattern, UErrorCode& status) {
    setPropertiesFromPattern(pattern, IGNORE_ROUNDING_NEVER, status);
    touch(status);
}